

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::updateDual(HEkkPrimal *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  HEkk *this_00;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  HighsInt iEl;
  long lVar11;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x49,0);
  this_00 = this->ekk_instance_;
  iVar1 = this->variable_in;
  pdVar5 = (this_00->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->theta_dual = pdVar5[iVar1] / this->alpha_col;
  iVar2 = (this->row_ap).count;
  piVar6 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar11 = 0; lVar11 < iVar2; lVar11 = lVar11 + 1) {
    iVar3 = piVar6[lVar11];
    pdVar5[iVar3] = pdVar5[iVar3] - this->theta_dual * pdVar7[iVar3];
  }
  uVar4 = (this->row_ep).count;
  piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->num_col;
  pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar8 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    lVar10 = (long)piVar6[uVar9];
    lVar11 = iVar2 + lVar10;
    pdVar5[lVar11] = pdVar5[lVar11] - this->theta_dual * pdVar7[lVar10];
  }
  pdVar5[iVar1] = 0.0;
  pdVar5[this->variable_out] = -this->theta_dual;
  HEkk::invalidateDualInfeasibilityRecord(this_00);
  (this->ekk_instance_->status_).has_dual_objective_value = false;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x49,0);
  return;
}

Assistant:

void HEkkPrimal::updateDual() {
  analysis->simplexTimerStart(UpdateDualClock);
  assert(alpha_col);
  assert(row_out >= 0);
  vector<double>& workDual = ekk_instance_.info_.workDual_;
  //  const vector<HighsInt>& nonbasicMove =
  //  ekk_instance_.basis_.nonbasicMove_;
  // Update the duals
  theta_dual = workDual[variable_in] / alpha_col;
  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    workDual[iCol] -= theta_dual * row_ap.array[iCol];
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    workDual[iCol] -= theta_dual * row_ep.array[iRow];
  }
  // Dual for the pivot
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;

  ekk_instance_.invalidateDualInfeasibilityRecord();
  // After dual update in primal simplex the dual objective value is not known
  ekk_instance_.status_.has_dual_objective_value = false;
  analysis->simplexTimerStop(UpdateDualClock);
}